

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O0

void do_nonatomic_op_i32(TCGContext_conflict9 *tcg_ctx,TCGv_i32 ret,TCGv_i32 addr,TCGv_i32 val,
                        TCGArg idx,MemOp memop,_Bool new_val,
                        _func_void_TCGContext_ptr_TCGv_i32_TCGv_i32_TCGv_i32_conflict9 *gen)

{
  MemOp memop_00;
  TCGv_i32 val_00;
  TCGv_i32 val_01;
  TCGv_i32 local_60;
  TCGv_i32 t2;
  TCGv_i32 t1;
  _Bool new_val_local;
  MemOp memop_local;
  TCGArg idx_local;
  TCGv_i32 val_local;
  TCGv_i32 addr_local;
  TCGv_i32 ret_local;
  TCGContext_conflict9 *tcg_ctx_local;
  
  val_00 = tcg_temp_new_i32(tcg_ctx);
  val_01 = tcg_temp_new_i32(tcg_ctx);
  memop_00 = tcg_canonicalize_memop(memop,false,false);
  tcg_gen_qemu_ld_i32_tricore(tcg_ctx,val_00,addr,idx,memop_00 & ~MO_ASHIFT);
  (*gen)(tcg_ctx,val_01,val_00,val);
  tcg_gen_qemu_st_i32_tricore(tcg_ctx,val_01,addr,idx,memop_00);
  local_60 = val_00;
  if (new_val) {
    local_60 = val_01;
  }
  tcg_gen_ext_i32(tcg_ctx,ret,local_60,memop_00);
  tcg_temp_free_i32(tcg_ctx,val_00);
  tcg_temp_free_i32(tcg_ctx,val_01);
  return;
}

Assistant:

static void do_nonatomic_op_i32(TCGContext *tcg_ctx, TCGv_i32 ret, TCGv addr, TCGv_i32 val,
                                TCGArg idx, MemOp memop, bool new_val,
                                void (*gen)(TCGContext *tcg_ctx, TCGv_i32, TCGv_i32, TCGv_i32))
{
    TCGv_i32 t1 = tcg_temp_new_i32(tcg_ctx);
    TCGv_i32 t2 = tcg_temp_new_i32(tcg_ctx);

    memop = tcg_canonicalize_memop(memop, 0, 0);

    tcg_gen_qemu_ld_i32(tcg_ctx, t1, addr, idx, memop & ~MO_SIGN);
    gen(tcg_ctx, t2, t1, val);
    tcg_gen_qemu_st_i32(tcg_ctx, t2, addr, idx, memop);

    tcg_gen_ext_i32(tcg_ctx, ret, (new_val ? t2 : t1), memop);
    tcg_temp_free_i32(tcg_ctx, t1);
    tcg_temp_free_i32(tcg_ctx, t2);
}